

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

void __thiscall capnp::_::OrphanBuilder::euthanize(OrphanBuilder *this)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *this_00;
  ExceptionCallback *pEVar1;
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *paVar2;
  Maybe<kj::Exception> exception;
  Runnable local_180;
  OrphanBuilder *local_178;
  Maybe<kj::Exception> local_170;
  
  local_180._vptr_Runnable = (_func_int **)&PTR_run_0020e468;
  local_178 = this;
  kj::_::runCatchingExceptions(&local_170,&local_180);
  this_00 = &local_170.ptr.field_1;
  paVar2 = (anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)0x0;
  if (local_170.ptr.isSet != false) {
    paVar2 = this_00;
  }
  if (local_170.ptr.isSet == true) {
    pEVar1 = kj::getExceptionCallback();
    (*pEVar1->_vptr_ExceptionCallback[2])(pEVar1,paVar2);
  }
  if (local_170.ptr.isSet == true) {
    kj::Exception::~Exception(&this_00->value);
  }
  return;
}

Assistant:

KJ_ALWAYS_INLINE(bool isNull() const) {
    // If the upper 32 bits are zero, this is a pointer to an empty struct.  We consider that to be
    // our "null" value.
    return (offsetAndKind.get() == 0) & (upper32Bits == 0);
  }